

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool maxValueScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  long lVar13;
  HighsLogOptions *log_options_;
  long lVar14;
  long lVar15;
  long lVar16;
  size_type sVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined8 uVar22;
  double dVar23;
  undefined8 uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<double,_std::allocator<double>_> row_max_value;
  allocator_type local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  vector<double,_std::allocator<double>_> local_48;
  value_type_conflict1 local_30;
  
  local_a8._8_8_ = local_a8._0_8_;
  iVar1 = lp->num_col_;
  lVar16 = (long)iVar1;
  iVar2 = lp->num_row_;
  local_c8 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_matrix_scale_factor);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)iVar2,&local_30,&local_d9);
  uVar22 = local_a8._8_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_a8._8_8_;
  local_a8 = auVar27 << 0x40;
  dVar20 = 0.0;
  local_b8 = INFINITY;
  dVar23 = INFINITY;
  if (0 < lVar16) {
    piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar20 = 0.0;
    dVar23 = INFINITY;
    lVar14 = 0;
    do {
      iVar3 = piVar5[lVar14];
      lVar15 = (long)iVar3;
      iVar4 = piVar5[lVar14 + 1];
      if (iVar3 < iVar4) {
        do {
          iVar3 = piVar6[lVar15];
          dVar25 = ABS(pdVar7[lVar15]);
          dVar21 = dVar25;
          if (dVar25 <= local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar3]) {
            dVar21 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3];
          }
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3] = dVar21;
          dVar21 = dVar25;
          if (dVar23 <= dVar25) {
            dVar21 = dVar23;
          }
          dVar23 = dVar21;
          if (dVar25 <= dVar20) {
            dVar25 = dVar20;
          }
          dVar20 = dVar25;
          lVar15 = lVar15 + 1;
        } while (iVar4 != lVar15);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar16);
  }
  local_90 = 1.0 / local_c8;
  local_d0 = INFINITY;
  uStack_50 = 0;
  uStack_60 = 0;
  local_68 = dVar23;
  local_58 = dVar20;
  if (0 < iVar2) {
    local_d0 = INFINITY;
    sVar17 = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar22;
    local_a8 = auVar11 << 0x40;
    do {
      dVar21 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar17];
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        dVar23 = log(1.0 / dVar21);
        dVar23 = floor(dVar23 / 0.6931471805599453 + 0.5);
        dVar23 = exp2(dVar23);
        if (dVar23 <= local_90) {
          dVar23 = local_90;
        }
        dVar20 = local_c8;
        if (dVar23 <= local_c8) {
          dVar20 = dVar23;
        }
        if (dVar20 <= local_d0) {
          local_d0 = dVar20;
        }
        dVar23 = (double)local_a8._0_8_;
        if ((double)local_a8._0_8_ <= dVar20) {
          dVar23 = dVar20;
        }
        local_a8._0_8_ = dVar23;
        (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar17] = dVar20;
        dVar23 = local_68;
        dVar20 = local_58;
      }
      sVar17 = sVar17 + 1;
    } while ((long)iVar2 != sVar17);
  }
  if (iVar1 < 1) {
    local_d8 = 0.0;
    dVar21 = INFINITY;
    uVar22 = 0;
    dVar25 = 0.0;
    uVar24 = 0;
  }
  else {
    dVar21 = INFINITY;
    uVar22 = 0;
    dVar25 = 0.0;
    uVar24 = 0;
    local_d8 = 0.0;
    local_b8 = INFINITY;
    lVar14 = 0;
    do {
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar5[lVar14];
      lVar15 = (long)iVar2;
      iVar3 = piVar5[lVar14 + 1];
      dVar18 = 0.0;
      if (iVar2 < iVar3) {
        piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = 0.0;
        do {
          dVar19 = pdVar8[piVar5[lVar15]] * pdVar7[lVar15];
          pdVar7[lVar15] = dVar19;
          dVar19 = ABS(dVar19);
          if (dVar19 <= dVar18) {
            dVar19 = dVar18;
          }
          dVar18 = dVar19;
          lVar15 = lVar15 + 1;
        } while (iVar3 != lVar15);
      }
      lVar15 = lVar14 + 1;
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        local_88 = dVar25;
        uStack_80 = uVar24;
        local_78 = dVar21;
        uStack_70 = uVar22;
        dVar23 = log(1.0 / dVar18);
        dVar23 = floor(dVar23 / 0.6931471805599453 + 0.5);
        dVar23 = exp2(dVar23);
        if (dVar23 <= local_90) {
          dVar23 = local_90;
        }
        dVar20 = local_c8;
        if (dVar23 <= local_c8) {
          dVar20 = dVar23;
        }
        if (dVar20 <= local_b8) {
          local_b8 = dVar20;
        }
        if (local_d8 <= dVar20) {
          local_d8 = dVar20;
        }
        pdVar7 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7[lVar14] = dVar20;
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = piVar5[lVar14];
        lVar13 = (long)iVar2;
        iVar3 = piVar5[lVar15];
        dVar21 = local_78;
        uVar22 = uStack_70;
        dVar23 = local_68;
        dVar25 = local_88;
        uVar24 = uStack_80;
        dVar20 = local_58;
        if (iVar2 < iVar3) {
          pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar18 = local_78;
          dVar19 = local_88;
          do {
            dVar25 = pdVar7[lVar14] * pdVar8[lVar13];
            pdVar8[lVar13] = dVar25;
            dVar25 = ABS(dVar25);
            uVar24 = 0;
            uVar22 = 0;
            dVar21 = dVar25;
            if (dVar18 <= dVar25) {
              dVar21 = dVar18;
            }
            if (dVar25 <= dVar19) {
              dVar25 = dVar19;
            }
            lVar13 = lVar13 + 1;
            dVar18 = dVar21;
            dVar19 = dVar25;
          } while (iVar3 != lVar13);
        }
      }
      lVar14 = lVar15;
    } while (lVar15 != lVar16);
  }
  dVar18 = local_b8;
  auVar26._8_8_ = dVar25;
  auVar26._0_8_ = dVar20;
  auVar10._8_8_ = dVar21;
  auVar10._0_8_ = dVar23;
  auVar27 = divpd(auVar26,auVar10);
  dStack_c0 = auVar27._8_8_;
  local_c8 = auVar27._0_8_ / dStack_c0;
  if (local_c8 <= 1.0) {
    if (0 < iVar1) {
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        iVar1 = piVar5[lVar14];
        lVar15 = (long)iVar1;
        iVar2 = piVar5[lVar14 + 1];
        if (iVar1 < iVar2) {
          do {
            pdVar9[lVar15] = pdVar9[lVar15] / (pdVar7[lVar14] * pdVar8[piVar6[lVar15]]);
            lVar15 = lVar15 + 1;
          } while (iVar2 != lVar15);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar16);
    }
    if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
      highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n",
                  local_c8,0x3ff0000000000000);
    }
  }
  else if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
    log_options_ = &(options->super_HighsOptionsStruct).log_options;
    uVar12 = local_a8._0_8_;
    local_b8 = dStack_c0;
    dStack_b0 = dStack_c0;
    local_a8 = auVar27;
    local_88 = dVar25;
    uStack_80 = uVar24;
    local_78 = dVar21;
    uStack_70 = uVar22;
    highsLogDev(log_options_,kInfo,
                "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                ,dVar18,local_d8,local_d0,uVar12);
    highsLogDev(log_options_,kInfo,
                "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                ,local_78,local_88,local_b8,local_68,local_58,local_a8._0_8_,local_c8);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 1.0 < local_c8;
}

Assistant:

bool maxValueScaleMatrix(const HighsOptions& options, HighsLp& lp,
                         const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;

  assert(options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue015 ||
         options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue0157);

  // The 015(7) values refer to bit settings in FICO's scaling options.
  // Specifically
  //
  // 0: Row scaling
  //
  // 1: Column scaling
  //
  // 5: Scale by maximum element
  //
  // 7: Scale objective function for the simplex method
  //
  // Note that 7 is not yet implemented, so
  // kSimplexScaleStrategyMaxValue015 and
  // kSimplexScaleStrategyMaxValue0157 are equivalent. However, cost
  // scaling could be well worth adding, now that the unscaled problem
  // can be solved using scaled NLA

  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;
  const double min_allow_row_scale = min_allow_scale;
  const double max_allow_row_scale = max_allow_scale;

  double min_row_scale = kHighsInf;
  double max_row_scale = 0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  // Determine the row scaling. Also determine the max/min row scaling
  // factors, and max/min original matrix values
  vector<double> row_max_value(numRow, 0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      const double value = fabs(Avalue[k]);
      row_max_value[iRow] = max(row_max_value[iRow], value);
      original_matrix_min_value = min(original_matrix_min_value, value);
      original_matrix_max_value = max(original_matrix_max_value, value);
    }
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (row_max_value[iRow]) {
      double row_scale_value = 1 / row_max_value[iRow];
      // Convert the row scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      row_scale_value = pow(2.0, floor(log(row_scale_value) / log2 + 0.5));
      row_scale_value =
          min(max(min_allow_row_scale, row_scale_value), max_allow_row_scale);
      min_row_scale = min(row_scale_value, min_row_scale);
      max_row_scale = max(row_scale_value, max_row_scale);
      rowScale[iRow] = row_scale_value;
    }
  }
  // Determine the column scaling, whilst applying the row scaling
  // Also determine the max/min column scaling factors, and max/min
  // matrix values
  double min_col_scale = kHighsInf;
  double max_col_scale = 0;
  double matrix_min_value = kHighsInf;
  double matrix_max_value = 0;
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double col_max_value = 0;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      Avalue[k] *= rowScale[iRow];
      const double value = fabs(Avalue[k]);
      col_max_value = max(col_max_value, value);
    }
    if (col_max_value) {
      double col_scale_value = 1 / col_max_value;
      // Convert the col scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
      col_scale_value =
          min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
      min_col_scale = min(col_scale_value, min_col_scale);
      max_col_scale = max(col_scale_value, max_col_scale);
      colScale[iCol] = col_scale_value;
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        Avalue[k] *= colScale[iCol];
        const double value = fabs(Avalue[k]);
        matrix_min_value = min(matrix_min_value, value);
        matrix_max_value = max(matrix_max_value, value);
      }
    }
  }
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;

  const double improvement_factor = matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor <= improvement_factor_required;

  if (poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(
          options.log_options, HighsLogType::kInfo,
          "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
          "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
          matrix_min_value, matrix_max_value, matrix_value_ratio,
          original_matrix_min_value, original_matrix_max_value,
          original_matrix_value_ratio, matrix_value_ratio_improvement);
    }
    return true;
  }
}